

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * declaration_specifiers(dmr_C *C,token *token,decl_state *ctx)

{
  uint *puVar1;
  symbol_op *psVar2;
  position pos;
  keyword kVar3;
  symbol *psVar4;
  char *pcVar5;
  char cVar6;
  uint what;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (((ulong)token->pos & 0x3f) == 2) {
    iVar8 = 0;
    iVar7 = 0;
    uVar9 = 0;
    do {
      psVar4 = dmrC_lookup_symbol((ident *)*(position *)((long)token + 0x10),NS_SYMBOL|NS_TYPEDEF);
      if ((psVar4 == (symbol *)0x0) || ((*(uint *)psVar4 >> 9 & 1) == 0)) break;
      if ((char)*(uint *)psVar4 == '\x11') {
        psVar2 = psVar4->op;
        kVar3 = psVar2->type;
        if ((kVar3 & KW_SPECIFIER) != 0) {
          what = psVar2->test & uVar9;
          if (what != 0) {
            specifier_conflict(C,token->pos,what,*(ident **)((long)token + 0x10));
            break;
          }
          uVar9 = uVar9 | psVar2->set;
          iVar7 = iVar7 + psVar2->cls;
          if (((uint)psVar2->set >> 0xb & 1) != 0) {
            iVar8 = 2;
          }
          if ((char)kVar3 < '\0') {
            iVar8 = -1;
          }
          else if ((kVar3 >> 8 & 1) != 0) {
            if (iVar8 == 0) {
              iVar8 = 1;
            }
            else {
              iVar8 = iVar8 + 1;
              if (iVar7 == 3) {
                pos = token->pos;
                pcVar5 = dmrC_show_ident(C,C->S->double_ident);
                dmrC_sparse_error(C,pos,"impossible combination of type specifiers: %s %s",
                                  "long long",pcVar5);
                iVar7 = 3;
                break;
              }
              uVar9 = uVar9 | 0x400;
            }
          }
        }
        token = *(token **)((long)token + 8);
        if (psVar2->declarator != (_func_token_ptr_dmr_C_ptr_token_ptr_decl_state_ptr *)0x0) {
          token = (*psVar2->declarator)(C,token,ctx);
          kVar3 = psVar4->op->type;
        }
        if ((kVar3 >> 9 & 1) != 0) {
          (ctx->ctype).base_type = (psVar4->field_14).field_2.ctype.base_type;
          (ctx->ctype).modifiers =
               (ctx->ctype).modifiers | (psVar4->field_14).field_2.ctype.modifiers;
        }
      }
      else {
        if ((uVar9 & 0x3c1) != 0) break;
        uVar9 = uVar9 | 3;
        (ctx->ctype).base_type = (psVar4->field_14).field_2.ctype.base_type;
        apply_ctype(C,token->pos,&(psVar4->field_14).field_2.ctype,&ctx->ctype);
        token = *(token **)((long)token + 8);
      }
    } while ((*(uint *)token & 0x3f) == 2);
    if ((uVar9 & 2) != 0) goto LAB_00118195;
    if ((uVar9 & 0x3c1) == 0) goto LAB_00118147;
    psVar4 = C->P->types[iVar7][iVar8];
  }
  else {
LAB_00118147:
    psVar4 = &C->S->incomplete_ctype;
  }
  (ctx->ctype).base_type = psVar4;
LAB_00118195:
  uVar9 = (uint)(ctx->ctype).modifiers;
  if ((int)uVar9 < 0) {
    (ctx->ctype).modifiers = (ulong)(uVar9 & 0x7fffffff);
    psVar4 = (ctx->ctype).base_type;
    cVar6 = *(char *)psVar4;
    if (cVar6 == '\x03') {
      psVar4 = (psVar4->field_14).field_2.ctype.base_type;
      cVar6 = *(char *)psVar4;
    }
    if (cVar6 == '\t') {
      psVar4 = (psVar4->field_14).field_2.ctype.base_type;
      cVar6 = *(char *)psVar4;
    }
    if ((cVar6 == '\r') || ((psVar4->field_14).field_2.ctype.base_type == &C->S->int_type)) {
      psVar4 = dmrC_alloc_symbol(C->S,token->pos,2);
      memcpy(psVar4,(ctx->ctype).base_type,0xe8);
      puVar1 = (uint *)((long)&psVar4->field_14 + 0x18);
      *puVar1 = *puVar1 & 0xbfffe03f;
      (psVar4->field_14).field_2.ctype.base_type = (ctx->ctype).base_type;
      *(undefined1 *)psVar4 = 0xf;
      (ctx->ctype).base_type = psVar4;
      dmrC_create_fouled(C->S,psVar4);
    }
    else {
      dmrC_sparse_error(C,token->pos,"invalid modifier");
    }
  }
  return (token *)(position)token;
}

Assistant:

static struct token *declaration_specifiers(struct dmr_C *C, struct token *token, struct decl_state *ctx)
{
	int seen = 0;
	int cls = CInt;
	int size = 0;

	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct symbol *s = dmrC_lookup_symbol(token->ident,
						 NS_TYPEDEF | NS_SYMBOL);
		if (!s || !(s->ns & NS_TYPEDEF))
			break;
		if (s->type != SYM_KEYWORD) {
			if (seen & Set_Any)
				break;
			seen |= Set_S | Set_T;
			ctx->ctype.base_type = s->ctype.base_type;
			apply_ctype(C, token->pos, &s->ctype, &ctx->ctype);
			token = token->next;
			continue;
		}
		if (s->op->type & KW_SPECIFIER) {
			if (seen & s->op->test) {
				specifier_conflict(C, token->pos,
						   seen & s->op->test,
						   token->ident);
				break;
			}
			seen |= s->op->set;
			cls += s->op->cls;
			if (s->op->set & Set_Int128)
				size = 2;
			if (s->op->type & KW_SHORT) {
				size = -1;
			} else if (s->op->type & KW_LONG && size++) {
				if (cls == CReal) {
					specifier_conflict(C, token->pos,
							   Set_Vlong,
							   C->S->double_ident);
					break;
				}
				seen |= Set_Vlong;
			}
		}
		token = token->next;
		if (s->op->declarator)
			token = s->op->declarator(C, token, ctx);
		if (s->op->type & KW_EXACT) {
			ctx->ctype.base_type = s->ctype.base_type;
			ctx->ctype.modifiers |= s->ctype.modifiers;
		}
	}

	if (!(seen & Set_S)) {	/* not set explicitly? */
		struct symbol *base = &C->S->incomplete_ctype;
		if (seen & Set_Any)
			base = C->P->types[cls][size];
		ctx->ctype.base_type = base;
	}

	if (ctx->ctype.modifiers & MOD_BITWISE) {
		struct symbol *type;
		ctx->ctype.modifiers &= ~MOD_BITWISE;
		if (!dmrC_is_int_type(C->S, ctx->ctype.base_type)) {
			dmrC_sparse_error(C, token->pos, "invalid modifier");
			return token;
		}
		type = dmrC_alloc_symbol(C->S, token->pos, SYM_BASETYPE);
		*type = *ctx->ctype.base_type;
		type->ctype.modifiers &= ~MOD_SPECIFIER;
		type->ctype.base_type = ctx->ctype.base_type;
		type->type = SYM_RESTRICT;
		ctx->ctype.base_type = type;
		dmrC_create_fouled(C->S, type);
	}
	return token;
}